

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

float64 GEO::Numeric::random_float64(void)

{
  double dVar1;
  
  dVar1 = drand48();
  return (float64)dVar1;
}

Assistant:

float64 random_float64() {
#if defined(GEO_OS_WINDOWS)
            return double(rand()) / double(RAND_MAX);
#elif defined(GEO_OS_ANDROID)
            // TODO: find a way to call drand48()
            // (problem at link time)
            return
                double(random_int32()) /
                double(std::numeric_limits<int32>::max());
#else
            return double(drand48());
#endif
        }